

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::CodedOutputStreamFieldSkipper::SkipUnknownEnum
          (CodedOutputStreamFieldSkipper *this,int field_number,int value)

{
  uint64 in_RDI;
  CodedOutputStream *unaff_retaddr;
  
  io::CodedOutputStream::WriteVarint32(unaff_retaddr,(uint32)(in_RDI >> 0x20));
  io::CodedOutputStream::WriteVarint64(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void CodedOutputStreamFieldSkipper::SkipUnknownEnum(int field_number,
                                                    int value) {
  unknown_fields_->WriteVarint32(field_number);
  unknown_fields_->WriteVarint64(value);
}